

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::insertAt
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t index,Name item)

{
  size_t sVar1;
  ulong local_30;
  size_t i;
  size_t index_local;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this_local;
  Name item_local;
  
  item_local.super_IString.str._M_len = item.super_IString.str._M_str;
  this_local = item.super_IString.str._M_len;
  sVar1 = size(this);
  if (index <= sVar1) {
    sVar1 = size(this);
    resize(this,sVar1 + 1);
    sVar1 = size(this);
    while (local_30 = sVar1 - 1, index < local_30) {
      ::wasm::Name::operator=(this->data + local_30,this->data + (sVar1 - 2));
      sVar1 = local_30;
    }
    ::wasm::Name::operator=(this->data + index,(Name *)&this_local);
    return;
  }
  __assert_fail("index <= size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0x174,
                "void ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::insertAt(size_t, T) [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
               );
}

Assistant:

void insertAt(size_t index, T item) {
    assert(index <= size()); // appending is ok
    resize(size() + 1);
    for (auto i = size() - 1; i > index; --i) {
      data[i] = data[i - 1];
    }
    data[index] = item;
  }